

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O2

void duckdb_je_large_prof_info_set(edata_t *edata,prof_tctx_t *tctx,size_t size)

{
  nstime_t t;
  nstime_t nStack_28;
  
  duckdb_je_nstime_prof_init_update(&nStack_28);
  duckdb_je_nstime_copy((nstime_t *)&(edata->field_6).ql_link_inactive,&nStack_28);
  (edata->field_6).e_prof_info.e_prof_alloc_size = size;
  duckdb_je_psset_init((psset_t *)edata);
  (edata->field_6).e_slab_data.bitmap[2] = (bitmap_t)tctx;
  return;
}

Assistant:

void
large_prof_info_set(edata_t *edata, prof_tctx_t *tctx, size_t size) {
	nstime_t t;
	nstime_prof_init_update(&t);
	edata_prof_alloc_time_set(edata, &t);
	edata_prof_alloc_size_set(edata, size);
	edata_prof_recent_alloc_init(edata);
	large_prof_tctx_set(edata, tctx);
}